

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::CalcTypematicPressedRepeatAmount
              (float t,float t_prev,float repeat_delay,float repeat_rate)

{
  undefined4 local_1c;
  int count;
  float repeat_rate_local;
  float repeat_delay_local;
  float t_prev_local;
  float t_local;
  undefined4 local_4;
  
  if ((t != 0.0) || (NAN(t))) {
    if ((t <= repeat_delay) || (repeat_rate <= 0.0)) {
      local_4 = 0;
    }
    else {
      local_1c = (int)((t - repeat_delay) / repeat_rate) -
                 (int)((t_prev - repeat_delay) / repeat_rate);
      if (local_1c < 1) {
        local_1c = 0;
      }
      local_4 = local_1c;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int ImGui::CalcTypematicPressedRepeatAmount(float t, float t_prev, float repeat_delay, float repeat_rate)
{
    if (t == 0.0f)
        return 1;
    if (t <= repeat_delay || repeat_rate <= 0.0f)
        return 0;
    const int count = (int)((t - repeat_delay) / repeat_rate) - (int)((t_prev - repeat_delay) / repeat_rate);
    return (count > 0) ? count : 0;
}